

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::SourceCodeInfo_Location::~SourceCodeInfo_Location(SourceCodeInfo_Location *this)

{
  SourceCodeInfo_Location *in_RDI;
  
  ~SourceCodeInfo_Location(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

SourceCodeInfo_Location::~SourceCodeInfo_Location() {
  // @@protoc_insertion_point(destructor:google.protobuf.SourceCodeInfo.Location)
  SharedDtor();
}